

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  bool bVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  string *psVar4;
  size_type sVar5;
  int local_70;
  int i;
  Voidify local_55 [20];
  byte local_41;
  LogMessage local_40;
  Voidify local_29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *detached_comments_local;
  string *trailing_local;
  string *leading_local;
  LocationRecorder *this_local;
  
  local_28 = detached_comments;
  detached_comments_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)trailing;
  trailing_local = leading;
  leading_local = (string *)this;
  bVar1 = SourceCodeInfo_Location::has_leading_comments(this->location_);
  local_41 = 0;
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x1be,"!location_->has_leading_comments()");
    local_41 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
  }
  if ((local_41 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  bVar1 = SourceCodeInfo_Location::has_trailing_comments(this->location_);
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&i,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x1bf,"!location_->has_trailing_comments()");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&i);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_55,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&i);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = SourceCodeInfo_Location::mutable_leading_comments_abi_cxx11_(this->location_);
    std::__cxx11::string::swap((string *)psVar4);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = SourceCodeInfo_Location::mutable_trailing_comments_abi_cxx11_(this->location_);
    std::__cxx11::string::swap((string *)psVar4);
  }
  for (local_70 = 0;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_28), (ulong)(long)local_70 < sVar5; local_70 = local_70 + 1) {
    psVar4 = SourceCodeInfo_Location::add_leading_detached_comments_abi_cxx11_(this->location_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_28,(long)local_70);
    std::__cxx11::string::swap((string *)psVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_28);
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    std::string* leading, std::string* trailing,
    std::vector<std::string>* detached_comments) const {
  ABSL_CHECK(!location_->has_leading_comments());
  ABSL_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap((*detached_comments)[i]);
  }
  detached_comments->clear();
}